

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O3

void __thiscall
LLVMBC::LLVMContext::append_typed_destructor<LLVMBC::ConstantDataVector>
          (LLVMContext *this,ConstantDataVector *ptr)

{
  pointer *pppDVar1;
  iterator __position;
  TypedDeleter<LLVMBC::ConstantDataVector> *local_18;
  ConstantDataVector *local_10;
  
  local_10 = ptr;
  local_18 = construct_trivial<LLVMBC::LLVMContext::TypedDeleter<LLVMBC::ConstantDataVector>,LLVMBC::ConstantDataVector*&>
                       (this,&local_10);
  __position._M_current =
       (this->typed_allocations).
       super__Vector_base<LLVMBC::LLVMContext::Deleter_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::LLVMContext::Deleter_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->typed_allocations).
      super__Vector_base<LLVMBC::LLVMContext::Deleter_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::LLVMContext::Deleter_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<LLVMBC::LLVMContext::Deleter*,dxil_spv::ThreadLocalAllocator<LLVMBC::LLVMContext::Deleter*>>
    ::_M_realloc_insert<LLVMBC::LLVMContext::Deleter*>
              ((vector<LLVMBC::LLVMContext::Deleter*,dxil_spv::ThreadLocalAllocator<LLVMBC::LLVMContext::Deleter*>>
                *)&this->typed_allocations,__position,(Deleter **)&local_18);
  }
  else {
    *__position._M_current = &local_18->super_Deleter;
    pppDVar1 = &(this->typed_allocations).
                super__Vector_base<LLVMBC::LLVMContext::Deleter_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::LLVMContext::Deleter_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppDVar1 = *pppDVar1 + 1;
  }
  return;
}

Assistant:

void append_typed_destructor(T *ptr)
	{
		typed_allocations.push_back(construct_trivial<TypedDeleter<T>>(ptr));
	}